

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O3

Env * leveldb::NewMemEnv(Env *base_env)

{
  Env *pEVar1;
  
  pEVar1 = (Env *)operator_new(0x68);
  pEVar1[1]._vptr_Env = (_func_int **)base_env;
  pEVar1->_vptr_Env = (_func_int **)&PTR__InMemoryEnv_0013cb50;
  pEVar1[2]._vptr_Env = (_func_int **)0x0;
  pEVar1[3]._vptr_Env = (_func_int **)0x0;
  pEVar1[4]._vptr_Env = (_func_int **)0x0;
  pEVar1[5]._vptr_Env = (_func_int **)0x0;
  pEVar1[6]._vptr_Env = (_func_int **)0x0;
  *(undefined4 *)&pEVar1[8]._vptr_Env = 0;
  pEVar1[9]._vptr_Env = (_func_int **)0x0;
  pEVar1[10]._vptr_Env = (_func_int **)(pEVar1 + 8);
  pEVar1[0xb]._vptr_Env = (_func_int **)(pEVar1 + 8);
  pEVar1[0xc]._vptr_Env = (_func_int **)0x0;
  return pEVar1;
}

Assistant:

Env* NewMemEnv(Env* base_env) { return new InMemoryEnv(base_env); }